

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

void __thiscall DIntermissionController::Destroy(DIntermissionController *this)

{
  DIntermissionScreen *pDVar1;
  FIntermissionDescriptor *pFVar2;
  
  DObject::Destroy(&this->super_DObject);
  pDVar1 = (this->mScreen).field_0.p;
  if (pDVar1 != (DIntermissionScreen *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      (*(((this->mScreen).field_0.p)->super_DObject)._vptr_DObject[4])();
    }
    else {
      (this->mScreen).field_0.p = (DIntermissionScreen *)0x0;
    }
  }
  if ((this->mDeleteDesc == true) &&
     (pFVar2 = this->mDesc, pFVar2 != (FIntermissionDescriptor *)0x0)) {
    TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray(&pFVar2->mActions)
    ;
    operator_delete(pFVar2,0x18);
  }
  this->mDesc = (FIntermissionDescriptor *)0x0;
  if (CurrentIntermission == this) {
    CurrentIntermission = (DIntermissionController *)0x0;
  }
  return;
}

Assistant:

void DIntermissionController::Destroy ()
{
	Super::Destroy();
	if (mScreen != NULL) mScreen->Destroy();
	if (mDeleteDesc) delete mDesc;
	mDesc = NULL;
	if (CurrentIntermission == this) CurrentIntermission = NULL;
}